

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

char * handle_fin(cio_websocket *websocket,uint8_t first_header_byte)

{
  byte bVar1;
  _Bool _Var2;
  byte local_1c;
  uint8_t opcode;
  uint8_t first_header_byte_local;
  cio_websocket *websocket_local;
  
  bVar1 = first_header_byte & 0xf;
  if (((uint)(websocket->ws_private).ws_flags & 1) == 0 && 7 < bVar1) {
    websocket_local = (cio_websocket *)anon_var_dwarf_3d10;
    return (char *)websocket_local;
  }
  if (((uint)(websocket->ws_private).ws_flags & 1) == 1) {
    if (bVar1 == 0) {
      if ((*(ushort *)&(websocket->ws_private).ws_flags >> 5 & 0xf) == 0) {
        websocket_local = (cio_websocket *)anon_var_dwarf_3d3e;
        return (char *)websocket_local;
      }
      *(ushort *)&(websocket->ws_private).ws_flags =
           *(ushort *)&(websocket->ws_private).ws_flags & 0xffe1 |
           (*(ushort *)&(websocket->ws_private).ws_flags >> 5 & 0xf) << 1;
      *(ushort *)&(websocket->ws_private).ws_flags =
           *(ushort *)&(websocket->ws_private).ws_flags & 0xfe1f;
    }
    else {
      local_1c = 0;
      if ((*(ushort *)&(websocket->ws_private).ws_flags >> 5 & 0xf) != 0) {
        _Var2 = is_control_frame((uint)bVar1);
        local_1c = _Var2 ^ 0xff;
      }
      if ((local_1c & 1) != 0) {
        websocket_local = (cio_websocket *)anon_var_dwarf_3d27;
        return (char *)websocket_local;
      }
      *(ushort *)&(websocket->ws_private).ws_flags =
           *(ushort *)&(websocket->ws_private).ws_flags & 0xffe1 | (ushort)bVar1 << 1;
    }
  }
  else if (bVar1 == 0) {
    if ((*(ushort *)&(websocket->ws_private).ws_flags >> 5 & 0xf) == 0) {
      websocket_local = (cio_websocket *)anon_var_dwarf_3d3e;
      return (char *)websocket_local;
    }
    *(ushort *)&(websocket->ws_private).ws_flags =
         *(ushort *)&(websocket->ws_private).ws_flags & 0xffe1 |
         (*(ushort *)&(websocket->ws_private).ws_flags >> 5 & 0xf) << 1;
  }
  else {
    if ((*(ushort *)&(websocket->ws_private).ws_flags >> 5 & 0xf) != 0) {
      websocket_local = (cio_websocket *)anon_var_dwarf_3d27;
      return (char *)websocket_local;
    }
    *(ushort *)&(websocket->ws_private).ws_flags =
         *(ushort *)&(websocket->ws_private).ws_flags & 0xfe1f | (ushort)bVar1 << 5;
    *(ushort *)&(websocket->ws_private).ws_flags =
         *(ushort *)&(websocket->ws_private).ws_flags & 0xffe1 | (ushort)bVar1 << 1;
  }
  return (char *)0x0;
}

Assistant:

static const char *handle_fin(struct cio_websocket *websocket, uint8_t first_header_byte)
{

	uint8_t opcode = first_header_byte & (uint8_t)OPCODE_MASK;

	if (cio_unlikely((websocket->ws_private.ws_flags.fin == 0) && (opcode >= CIO_WEBSOCKET_CLOSE_FRAME))) {
		return "got fragmented control frame";
	}

	if (websocket->ws_private.ws_flags.fin == 1U) {
		if (opcode != CIO_WEBSOCKET_CONTINUATION_FRAME) {
			if (cio_unlikely(websocket->ws_private.ws_flags.frag_opcode && !is_control_frame(opcode))) {
				return "got non-continuation frame within fragmented stream";
			}

			websocket->ws_private.ws_flags.opcode = (unsigned char)(opcode & (uint8_t)OPCODE_MASK);
		} else {
			if (cio_unlikely(!websocket->ws_private.ws_flags.frag_opcode)) {
				return "got continuation frame without correct start frame";
			}

			websocket->ws_private.ws_flags.opcode = websocket->ws_private.ws_flags.frag_opcode;
			websocket->ws_private.ws_flags.frag_opcode = 0;
		}
	} else {
		if (opcode != CIO_WEBSOCKET_CONTINUATION_FRAME) {
			if (cio_unlikely(websocket->ws_private.ws_flags.frag_opcode)) {
				return "got non-continuation frame within fragmented stream";
			}

			websocket->ws_private.ws_flags.frag_opcode = (unsigned char)(opcode & (uint8_t)OPCODE_MASK);
			websocket->ws_private.ws_flags.opcode = (unsigned char)(opcode & (uint8_t)OPCODE_MASK);
		} else {
			if (cio_unlikely(!websocket->ws_private.ws_flags.frag_opcode)) {
				return "got continuation frame without correct start frame";
			}

			websocket->ws_private.ws_flags.opcode = websocket->ws_private.ws_flags.frag_opcode;
		}
	}

	return NULL;
}